

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

float Abc_NtkMfsTotalSwitching(Abc_Ntk_t *pNtk)

{
  int *piVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar2;
  Aig_Man_t *pAig;
  Vec_Int_t *p;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  float fVar6;
  
  iVar5 = 0;
  pNtk_00 = Abc_NtkStrash(pNtk,0,1,0);
  do {
    if (pNtk->vObjs->nSize <= iVar5) {
      pAig = Abc_NtkToDar(pNtk_00,0,(uint)(0 < pNtk->nObjCounts[8]));
      p = Saig_ManComputeSwitchProbs(pAig,0x30,0x10,0);
      piVar1 = p->pArray;
      fVar6 = 0.0;
      for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
        pAVar2 = Abc_NtkObj(pNtk,iVar5);
        if (((pAVar2 != (Abc_Obj_t *)0x0) &&
            (uVar4 = (ulong)(pAVar2->field_6).pTemp & 0xfffffffffffffffe, uVar4 != 0)) &&
           (uVar4 = *(ulong *)(uVar4 + 0x40) & 0xfffffffffffffffe, uVar4 != 0)) {
          fVar6 = fVar6 + (float)(pAVar2->vFanouts).nSize * (float)piVar1[*(int *)(uVar4 + 0x24)];
        }
      }
      Vec_IntFree(p);
      Aig_ManStop(pAig);
      Abc_NtkDelete(pNtk_00);
      return fVar6;
    }
    pAVar2 = Abc_NtkObj(pNtk,iVar5);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      if ((*(byte *)(((ulong)(pAVar2->field_6).pTemp & 0xfffffffffffffffe) + 0x14) & 0xf) != 0) {
        uVar3 = *(uint *)&pAVar2->field_0x14 & 0xf;
        if ((uVar3 < 8) && ((0xa4U >> uVar3 & 1) != 0)) goto LAB_00264c45;
      }
      (pAVar2->field_6).pTemp = (void *)0x0;
    }
LAB_00264c45:
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

float Abc_NtkMfsTotalSwitching( Abc_Ntk_t * pNtk )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vSwitching;
    float * pSwitching;
    Abc_Ntk_t * pNtkStr;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObjAig;
    Abc_Obj_t * pObjAbc, * pObjAbc2;
    float Result = (float)0;
    int i;
    // strash the network
    pNtkStr = Abc_NtkStrash( pNtk, 0, 1, 0 );
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
        if ( Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)->Type == ABC_FUNC_NONE || (!Abc_ObjIsCi(pObjAbc) && !Abc_ObjIsNode(pObjAbc)) )
            pObjAbc->pTemp = NULL;
    // map network into an AIG
    pAig = Abc_NtkToDar( pNtkStr, 0, (int)(Abc_NtkLatchNum(pNtk) > 0) );
    vSwitching = Saig_ManComputeSwitchProbs( pAig, 48, 16, 0 );
    pSwitching = (float *)vSwitching->pArray;
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
    {
        if ( (pObjAbc2 = Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)) && (pObjAig = Aig_Regular((Aig_Obj_t *)pObjAbc2->pTemp)) )
        {
            Result += Abc_ObjFanoutNum(pObjAbc) * pSwitching[pObjAig->Id];
//            Abc_ObjPrint( stdout, pObjAbc );
//            printf( "%d = %.2f\n", i, Abc_ObjFanoutNum(pObjAbc) * pSwitching[pObjAig->Id] );
        }
    }
    Vec_IntFree( vSwitching );
    Aig_ManStop( pAig );
    Abc_NtkDelete( pNtkStr );
    return Result;
}